

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

UnlocalizedNumberFormatter * __thiscall
icu_63::number::UnlocalizedNumberFormatter::operator=(UnlocalizedNumberFormatter *this,UNF *src)

{
  impl::MacroProps::operator=((MacroProps *)this,(MacroProps *)src);
  return this;
}

Assistant:

UnlocalizedNumberFormatter& UnlocalizedNumberFormatter::operator=(UNF&& src) U_NOEXCEPT {
    NFS<UNF>::operator=(static_cast<NFS<UNF>&&>(src));
    // No additional fields to assign
    return *this;
}